

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void __thiscall LZ77Compressor::add(LZ77Compressor *this,uint8_t *bytes,int offset)

{
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined4 in_stack_ffffffffffffffe8;
  
  hash((uint8_t *)
       ((long)&(in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)in_EDX));
  std::vector<int,_std::allocator<int>_>::push_back
            (in_RSI,(value_type_conflict2 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void add(const uint8_t* bytes, int offset) {
		dict[hash(bytes + offset)].push_back(offset);
	}